

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O3

string * __thiscall
t_haxe_generator::declare_field_abi_cxx11_
          (string *__return_storage_ptr__,t_haxe_generator *this,t_field *tfield,bool init)

{
  pointer pcVar1;
  string name;
  char cVar2;
  long *plVar3;
  t_const_value *value;
  undefined8 *puVar4;
  _Base_ptr *pp_Var5;
  t_type *type;
  _Alloc_hider _Var6;
  _Base_ptr p_Var7;
  undefined8 uVar8;
  string result;
  ofstream dummy;
  undefined8 in_stack_fffffffffffffd48;
  _Alloc_hider in_stack_fffffffffffffd50;
  size_type in_stack_fffffffffffffd58;
  undefined8 in_stack_fffffffffffffd60;
  string local_290;
  t_type *local_270;
  long local_268;
  undefined1 local_260 [16];
  undefined1 *local_250;
  undefined1 local_240 [16];
  undefined1 local_230 [8];
  long local_228;
  _Base_ptr local_220;
  _Base_ptr p_Stack_218;
  ios_base local_138 [264];
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffd50,"var ",&tfield->name_);
  plVar3 = (long *)std::__cxx11::string::append((char *)&stack0xfffffffffffffd50);
  pp_Var5 = (_Base_ptr *)(plVar3 + 2);
  if ((_Base_ptr *)*plVar3 == pp_Var5) {
    local_220 = *pp_Var5;
    p_Stack_218 = (_Base_ptr)plVar3[3];
    local_230 = (undefined1  [8])&local_220;
  }
  else {
    local_220 = *pp_Var5;
    local_230 = (undefined1  [8])*plVar3;
  }
  local_228 = plVar3[1];
  *plVar3 = (long)pp_Var5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  type_name_abi_cxx11_(&local_290,this,tfield->type_,false,false);
  p_Var7 = (_Base_ptr)0xf;
  if (local_230 != (undefined1  [8])&local_220) {
    p_Var7 = local_220;
  }
  if (p_Var7 < (_Base_ptr)(local_290._M_string_length + local_228)) {
    uVar8 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      uVar8 = local_290.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < (_Base_ptr)(local_290._M_string_length + local_228)) goto LAB_002326f8;
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_230)
    ;
  }
  else {
LAB_002326f8:
    plVar3 = (long *)std::__cxx11::string::_M_append(local_230,(ulong)local_290._M_dataplus._M_p);
  }
  local_270 = (t_type *)local_260;
  type = (t_type *)(plVar3 + 2);
  if ((t_type *)*plVar3 == type) {
    local_260._0_8_ = (type->super_t_doc)._vptr_t_doc;
    local_260._8_8_ = plVar3[3];
  }
  else {
    local_260._0_8_ = (type->super_t_doc)._vptr_t_doc;
    local_270 = (t_type *)*plVar3;
  }
  local_268 = plVar3[1];
  *plVar3 = (long)type;
  plVar3[1] = 0;
  *(undefined1 *)&(type->super_t_doc)._vptr_t_doc = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  if (local_230 != (undefined1  [8])&local_220) {
    operator_delete((void *)local_230);
  }
  if (in_stack_fffffffffffffd50._M_p != &stack0xfffffffffffffd60) {
    operator_delete(in_stack_fffffffffffffd50._M_p);
  }
  if (!init) goto switchD_0023288a_default;
  value = (t_const_value *)t_type::get_true_type(tfield->type_);
  cVar2 = (**(code **)(*(long *)&(value->mapVal_)._M_t._M_impl + 0x28))(value);
  if ((cVar2 != '\0') && (tfield->value_ != (t_const_value *)0x0)) {
    std::ofstream::ofstream(local_230);
    pcVar1 = (tfield->name_)._M_dataplus._M_p;
    local_250 = local_240;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_250,pcVar1,pcVar1 + (tfield->name_)._M_string_length);
    name._M_string_length = (size_type)in_stack_fffffffffffffd50._M_p;
    name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd48;
    name.field_2._M_allocated_capacity = in_stack_fffffffffffffd58;
    name.field_2._8_8_ = in_stack_fffffffffffffd60;
    render_const_value(&local_290,this,(ostream *)local_230,name,type,value);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,0x385a2d);
    _Var6._M_p = &stack0xfffffffffffffd60;
    if ((long *)*plVar3 != plVar3 + 2) {
      _Var6._M_p = (pointer)*plVar3;
    }
    *plVar3 = (long)(plVar3 + 2);
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_270,(ulong)_Var6._M_p);
    if (_Var6._M_p != &stack0xfffffffffffffd60) {
      operator_delete(_Var6._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p);
    }
    if (local_250 != local_240) {
      operator_delete(local_250);
    }
    local_230 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_230 + (long)_VTT[-3]) = _PyCFunction_Type;
    std::filebuf::~filebuf((filebuf *)&local_228);
    std::ios_base::~ios_base(local_138);
    goto switchD_0023288a_default;
  }
  cVar2 = (**(code **)(*(long *)&(value->mapVal_)._M_t._M_impl + 0x28))(value);
  if (cVar2 != '\0') {
    switch(*(undefined4 *)&(value->identifierVal_).field_2) {
    case 0:
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = "NO T_VOID CONSTRUCT";
      __cxa_throw(puVar4,&char_const*::typeinfo,0);
    case 1:
      break;
    case 2:
      break;
    case 3:
    case 4:
    case 5:
    case 6:
      break;
    case 7:
      break;
    default:
      goto switchD_0023288a_default;
    }
    std::__cxx11::string::append((char *)&local_270);
    goto switchD_0023288a_default;
  }
  cVar2 = (**(code **)(*(long *)&(value->mapVal_)._M_t._M_impl + 0x50))(value);
  if (cVar2 != '\0') {
    std::__cxx11::string::append((char *)&local_270);
    goto switchD_0023288a_default;
  }
  cVar2 = (**(code **)(*(long *)&(value->mapVal_)._M_t._M_impl + 0x68))(value);
  if (cVar2 == '\0') {
    type_name_abi_cxx11_(&local_290,this,(t_type *)value,false,false);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,0x396a8f);
    _Var6._M_p = &stack0xfffffffffffffd60;
    if ((long *)*plVar3 != plVar3 + 2) {
      _Var6._M_p = (pointer)*plVar3;
    }
    *plVar3 = (long)(plVar3 + 2);
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append(&stack0xfffffffffffffd50);
    pp_Var5 = (_Base_ptr *)(puVar4 + 2);
    if ((_Base_ptr *)*puVar4 == pp_Var5) {
      local_220 = *pp_Var5;
      p_Stack_218 = (_Base_ptr)puVar4[3];
      local_230 = (undefined1  [8])&local_220;
    }
    else {
      local_220 = *pp_Var5;
      local_230 = (undefined1  [8])*puVar4;
    }
    local_228 = puVar4[1];
    *puVar4 = pp_Var5;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_230);
    if (local_230 != (undefined1  [8])&local_220) {
      operator_delete((void *)local_230);
    }
    if (_Var6._M_p != &stack0xfffffffffffffd60) goto LAB_00232b66;
  }
  else {
    type_name_abi_cxx11_(&local_290,this,(t_type *)value,false,false);
    _Var6._M_p = &stack0xfffffffffffffd60;
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,0x396a8f);
    if ((long *)*plVar3 != plVar3 + 2) {
      _Var6._M_p = (pointer)*plVar3;
    }
    *plVar3 = (long)(plVar3 + 2);
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append(&stack0xfffffffffffffd50);
    pp_Var5 = (_Base_ptr *)(puVar4 + 2);
    if ((_Base_ptr *)*puVar4 == pp_Var5) {
      local_220 = *pp_Var5;
      p_Stack_218 = (_Base_ptr)puVar4[3];
      local_230 = (undefined1  [8])&local_220;
    }
    else {
      local_220 = *pp_Var5;
      local_230 = (undefined1  [8])*puVar4;
    }
    local_228 = puVar4[1];
    *puVar4 = pp_Var5;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_230);
    if (local_230 != (undefined1  [8])&local_220) {
      operator_delete((void *)local_230);
    }
    if (_Var6._M_p != &stack0xfffffffffffffd60) {
LAB_00232b66:
      operator_delete(_Var6._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
switchD_0023288a_default:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_270,
             (long)&(local_270->super_t_doc)._vptr_t_doc + local_268);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (local_270 != (t_type *)local_260) {
    operator_delete(local_270);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_haxe_generator::declare_field(t_field* tfield, bool init) {
  // TODO(mcslee): do we ever need to initialize the field?
  string result = "var " + tfield->get_name() + " : " + type_name(tfield->get_type());
  if (init) {
    t_type* ttype = get_true_type(tfield->get_type());
    if (ttype->is_base_type() && tfield->get_value() != nullptr) {
      std::ofstream dummy;
      result += " = " + render_const_value(dummy, tfield->get_name(), ttype, tfield->get_value());
    } else if (ttype->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)ttype)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "NO T_VOID CONSTRUCT";
      case t_base_type::TYPE_STRING:
        result += " = null";
        break;
      case t_base_type::TYPE_BOOL:
        result += " = false";
        break;
      case t_base_type::TYPE_I8:
      case t_base_type::TYPE_I16:
      case t_base_type::TYPE_I32:
      case t_base_type::TYPE_I64:
        result += " = 0";
        break;
      case t_base_type::TYPE_DOUBLE:
        result += " = (double)0";
        break;
      }

    } else if (ttype->is_enum()) {
      result += " = 0";
    } else if (ttype->is_container()) {
      result += " = new " + type_name(ttype, false, true) + "()";
    } else {
      result += " = new " + type_name(ttype, false, true) + "()";
    }
  }
  return result + ";";
}